

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int uv__tcp_listen(uv_tcp_t *tcp,int backlog,uv_connection_cb cb)

{
  int iVar1;
  int *piVar2;
  int err;
  uint flags;
  uv_connection_cb cb_local;
  int backlog_local;
  uv_tcp_t *tcp_local;
  
  if (tcp->delayed_error == 0) {
    tcp_local._4_4_ = maybe_new_socket(tcp,2,0);
    if (tcp_local._4_4_ == 0) {
      iVar1 = listen((tcp->io_watcher).fd,backlog);
      if (iVar1 == 0) {
        tcp->connection_cb = cb;
        tcp->flags = tcp->flags | 0x2000;
        (tcp->io_watcher).cb = uv__server_io;
        uv__io_start(tcp->loop,&tcp->io_watcher,1);
        tcp_local._4_4_ = 0;
      }
      else {
        piVar2 = __errno_location();
        tcp_local._4_4_ = -*piVar2;
      }
    }
  }
  else {
    tcp_local._4_4_ = tcp->delayed_error;
  }
  return tcp_local._4_4_;
}

Assistant:

int uv__tcp_listen(uv_tcp_t* tcp, int backlog, uv_connection_cb cb) {
  unsigned int flags;
  int err;

  if (tcp->delayed_error)
    return tcp->delayed_error;

  flags = 0;
#if defined(__MVS__)
  /* on zOS the listen call does not bind automatically
     if the socket is unbound. Hence the manual binding to
     an arbitrary port is required to be done manually
  */
  flags |= UV_HANDLE_BOUND;
#endif
  err = maybe_new_socket(tcp, AF_INET, flags);
  if (err)
    return err;

  if (listen(tcp->io_watcher.fd, backlog))
    return UV__ERR(errno);

  tcp->connection_cb = cb;
  tcp->flags |= UV_HANDLE_BOUND;

  /* Start listening for connections. */
  tcp->io_watcher.cb = uv__server_io;
  uv__io_start(tcp->loop, &tcp->io_watcher, POLLIN);

  return 0;
}